

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_uv_rsn(REF_DBL *uv,REF_DBL *r,REF_DBL *s,REF_DBL *n,REF_DBL *drsduv)

{
  double dVar1;
  REF_STATUS ref_private_macro_code_raise_2;
  REF_STATUS ref_private_macro_code_raise_1;
  REF_STATUS ref_private_macro_code_raise;
  REF_DBL len;
  REF_DBL dot;
  REF_INT i;
  REF_DBL *drsduv_local;
  REF_DBL *n_local;
  REF_DBL *s_local;
  REF_DBL *r_local;
  REF_DBL *uv_local;
  
  for (dot._4_4_ = 0; dot._4_4_ < 3; dot._4_4_ = dot._4_4_ + 1) {
    r[dot._4_4_] = uv[dot._4_4_];
  }
  *drsduv = 1.0;
  drsduv[1] = 0.0;
  for (dot._4_4_ = 0; dot._4_4_ < 3; dot._4_4_ = dot._4_4_ + 1) {
    s[dot._4_4_] = uv[dot._4_4_ + 3];
  }
  drsduv[2] = 0.0;
  drsduv[3] = 1.0;
  dVar1 = sqrt(r[2] * r[2] + *r * *r + r[1] * r[1]);
  *drsduv = *drsduv / dVar1;
  drsduv[1] = drsduv[1] / dVar1;
  uv_local._4_4_ = ref_math_normalize(r);
  if (uv_local._4_4_ == 0) {
    dVar1 = sqrt(s[2] * s[2] + *s * *s + s[1] * s[1]);
    drsduv[2] = drsduv[2] / dVar1;
    drsduv[3] = drsduv[3] / dVar1;
    uv_local._4_4_ = ref_math_normalize(s);
    if (uv_local._4_4_ == 0) {
      dVar1 = r[2] * s[2] + *r * *s + r[1] * s[1];
      for (dot._4_4_ = 0; dot._4_4_ < 3; dot._4_4_ = dot._4_4_ + 1) {
        s[dot._4_4_] = -dVar1 * r[dot._4_4_] + s[dot._4_4_];
      }
      drsduv[2] = -dVar1 * *drsduv + drsduv[2];
      drsduv[3] = -dVar1 * drsduv[1] + drsduv[3];
      dVar1 = sqrt(s[2] * s[2] + *s * *s + s[1] * s[1]);
      drsduv[2] = drsduv[2] / dVar1;
      drsduv[3] = drsduv[3] / dVar1;
      uv_local._4_4_ = ref_math_normalize(s);
      if (uv_local._4_4_ == 0) {
        *n = r[1] * s[2] + -(r[2] * s[1]);
        n[1] = r[2] * *s + -(*r * s[2]);
        n[2] = *r * s[1] + -(r[1] * *s);
        uv_local._4_4_ = 0;
      }
    }
  }
  return uv_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_rsn(REF_DBL *uv, REF_DBL *r, REF_DBL *s,
                                   REF_DBL *n, REF_DBL *drsduv) {
  REF_INT i;
  REF_DBL dot;
  REF_DBL len;

  for (i = 0; i < 3; i++) r[i] = uv[i];
  drsduv[0] = 1.0;
  drsduv[1] = 0.0;
  for (i = 0; i < 3; i++) s[i] = uv[i + 3];
  drsduv[2] = 0.0;
  drsduv[3] = 1.0;
  len = sqrt(ref_math_dot(r, r));
  drsduv[0] /= len;
  drsduv[1] /= len;
  RAISE(ref_math_normalize(r));
  len = sqrt(ref_math_dot(s, s));
  drsduv[2] /= len;
  drsduv[3] /= len;
  RAISE(ref_math_normalize(s));

  dot = ref_math_dot(r, s);
  for (i = 0; i < 3; i++) s[i] -= dot * r[i];
  drsduv[2] -= dot * drsduv[0];
  drsduv[3] -= dot * drsduv[1];

  len = sqrt(ref_math_dot(s, s));
  drsduv[2] /= len;
  drsduv[3] /= len;
  RAISE(ref_math_normalize(s));

  ref_math_cross_product(r, s, n);

  return REF_SUCCESS;
}